

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_object.cpp
# Opt level: O3

gc_heap_ptr<mjs::regexp_object> __thiscall
mjs::anon_unknown_35::cast_to_regexp(anon_unknown_35 *this,value *v)

{
  bool bVar1;
  gc_heap *in_RAX;
  gc_heap *extraout_RAX;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  gc_heap_ptr<mjs::regexp_object> gVar2;
  object_ptr o;
  gc_heap_ptr_untyped local_18;
  
  if (v->type_ == object) {
    local_18.heap_ =
         (v->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_;
    local_18.pos_ = *(uint32_t *)((long)&v->field_1 + 8);
    if (local_18.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_18.heap_,&local_18);
    }
    bVar1 = gc_heap_ptr_untyped::has_type<mjs::regexp_object>(&local_18);
    if (bVar1) {
      *(gc_heap **)this = local_18.heap_;
      *(uint32_t *)(this + 8) = local_18.pos_;
      if (local_18.heap_ != (gc_heap *)0x0) {
        gc_heap::attach(local_18.heap_,(gc_heap_ptr_untyped *)this);
      }
    }
    else {
      *(undefined8 *)this = 0;
      *(undefined4 *)(this + 8) = 0;
    }
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_18);
    in_RAX = extraout_RAX;
    in_RDX = extraout_RDX;
  }
  else {
    *(undefined8 *)this = 0;
    *(undefined4 *)(this + 8) = 0;
  }
  gVar2.super_gc_heap_ptr_untyped._8_8_ = in_RDX;
  gVar2.super_gc_heap_ptr_untyped.heap_ = in_RAX;
  return (gc_heap_ptr<mjs::regexp_object>)gVar2.super_gc_heap_ptr_untyped;
}

Assistant:

gc_heap_ptr<regexp_object> cast_to_regexp(const value& v) {
    if (v.type() != value_type::object) {
        return nullptr;
    }
    auto o = v.object_value();
    if (!o.has_type<regexp_object>()) {
        return nullptr;
    }
    return gc_heap_ptr<regexp_object>{o};
}